

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTest::initPrograms
          (GraphicsCacheTest *this,SourceCollections *programCollection)

{
  VkShaderStageFlagBits VVar1;
  ProgramSources *pPVar2;
  ulong uVar3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  SourceCollections *local_a0;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  uVar3 = 0;
  local_a0 = programCollection;
  do {
    if ((uint)(this->super_CacheTest).m_param.m_shaderCount <= uVar3) {
      return;
    }
    VVar1 = (this->super_CacheTest).m_param.m_shaders[uVar3];
    switch(VVar1) {
    case VK_SHADER_STAGE_VERTEX_BIT:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"color_vert",&local_a1)
      ;
      pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_a0->glslSources,&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "#version 310 es\nlayout(location = 0) in vec4 position;\nlayout(location = 1) in vec4 color;\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n  gl_Position = position;\n  vtxColor = color;\n}\n"
                 ,&local_a2);
      glu::VertexSource::VertexSource((VertexSource *)local_98,&local_70);
      glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_98);
      break;
    case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"basic_tcs",&local_a1);
      pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_a0->glslSources,&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "#version 450 \nlayout(vertices = 3) out;\nlayout(location = 0) in highp vec4 color[];\nlayout(location = 0) out highp vec4 vtxColor[];\nout gl_PerVertex { vec4 gl_Position; } gl_out[3];\nin gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\nvoid main()\n{\n  gl_TessLevelOuter[0] = 4.0;\n  gl_TessLevelOuter[1] = 4.0;\n  gl_TessLevelOuter[2] = 4.0;\n  gl_TessLevelInner[0] = 4.0;\n  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n  vtxColor[gl_InvocationID] = color[gl_InvocationID];\n}\n"
                 ,&local_a2);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)local_98,&local_70);
      glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_98);
      break;
    case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
         VK_SHADER_STAGE_VERTEX_BIT:
      goto switchD_004c60f6_caseD_3;
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"basic_tes",&local_a1);
      pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_a0->glslSources,&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "#version 450 \nlayout(triangles, fractional_even_spacing, ccw) in;\nlayout(location = 0) in highp vec4 colors[];\nlayout(location = 0) out highp vec4 vtxColor;\nout gl_PerVertex { vec4 gl_Position; };\nin gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\nvoid main() \n{\n  float u = gl_TessCoord.x;\n  float v = gl_TessCoord.y;\n  float w = gl_TessCoord.z;\n  vec4 pos = vec4(0);\n  vec4 color = vec4(0);\n  pos.xyz += u * gl_in[0].gl_Position.xyz;\n  color.xyz += u * colors[0].xyz;\n  pos.xyz += v * gl_in[1].gl_Position.xyz;\n  color.xyz += v * colors[1].xyz;\n  pos.xyz += w * gl_in[2].gl_Position.xyz;\n  color.xyz += w * colors[2].xyz;\n  pos.w = 1.0;\n  color.w = 1.0;\n  gl_Position = pos;\n  vtxColor = color;\n}\n"
                 ,&local_a2);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)local_98,&local_70);
      glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_98);
      break;
    case VK_SHADER_STAGE_GEOMETRY_BIT:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"dummy_geo",&local_a1);
      pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_a0->glslSources,&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "#version 450 \nlayout(triangles) in;\nlayout(triangle_strip, max_vertices = 3) out;\nlayout(location = 0) in highp vec4 in_vtxColor[];\nlayout(location = 0) out highp vec4 vtxColor;\nout gl_PerVertex { vec4 gl_Position; };\nin gl_PerVertex { vec4 gl_Position; } gl_in[];\nvoid main (void)\n{\n  for(int ndx=0; ndx<3; ndx++)\n  {\n    gl_Position = gl_in[ndx].gl_Position;\n    vtxColor    = in_vtxColor[ndx];\n    EmitVertex();\n  }\n  EndPrimitive();\n}\n"
                 ,&local_a2);
      glu::GeometrySource::GeometrySource((GeometrySource *)local_98,&local_70);
      glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_98);
      break;
    default:
      if (VVar1 == VK_SHADER_STAGE_FRAGMENT_BIT) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"color_frag",&local_a1);
        pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_a0->glslSources,&local_50)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "#version 310 es\nlayout(location = 0) in highp vec4 vtxColor;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n  fragColor = vtxColor;\n}\n"
                   ,&local_a2);
        glu::FragmentSource::FragmentSource((FragmentSource *)local_98,&local_70);
        glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_98);
        break;
      }
      goto switchD_004c60f6_caseD_3;
    }
    std::__cxx11::string::~string((string *)(local_98 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
switchD_004c60f6_caseD_3:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void GraphicsCacheTest::initPrograms (SourceCollections& programCollection) const
{
	for (deUint32 shaderNdx = 0; shaderNdx < m_param.getShaderCount(); shaderNdx++)
	{
		switch(m_param.getShaderFlag(shaderNdx))
		{
			case VK_SHADER_STAGE_VERTEX_BIT:
				programCollection.glslSources.add("color_vert") << glu::VertexSource(
					"#version 310 es\n"
					"layout(location = 0) in vec4 position;\n"
					"layout(location = 1) in vec4 color;\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"void main (void)\n"
					"{\n"
					"  gl_Position = position;\n"
					"  vtxColor = color;\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_FRAGMENT_BIT:
				programCollection.glslSources.add("color_frag") << glu::FragmentSource(
					"#version 310 es\n"
					"layout(location = 0) in highp vec4 vtxColor;\n"
					"layout(location = 0) out highp vec4 fragColor;\n"
					"void main (void)\n"
					"{\n"
					"  fragColor = vtxColor;\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_GEOMETRY_BIT:
				programCollection.glslSources.add("dummy_geo") << glu::GeometrySource(
					"#version 450 \n"
					"layout(triangles) in;\n"
					"layout(triangle_strip, max_vertices = 3) out;\n"
					"layout(location = 0) in highp vec4 in_vtxColor[];\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"out gl_PerVertex { vec4 gl_Position; };\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n"
					"void main (void)\n"
					"{\n"
					"  for(int ndx=0; ndx<3; ndx++)\n"
					"  {\n"
					"    gl_Position = gl_in[ndx].gl_Position;\n"
					"    vtxColor    = in_vtxColor[ndx];\n"
					"    EmitVertex();\n"
					"  }\n"
					"  EndPrimitive();\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				programCollection.glslSources.add("basic_tcs") << glu::TessellationControlSource(
					"#version 450 \n"
					"layout(vertices = 3) out;\n"
					"layout(location = 0) in highp vec4 color[];\n"
					"layout(location = 0) out highp vec4 vtxColor[];\n"
					"out gl_PerVertex { vec4 gl_Position; } gl_out[3];\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\n"
					"void main()\n"
					"{\n"
					"  gl_TessLevelOuter[0] = 4.0;\n"
					"  gl_TessLevelOuter[1] = 4.0;\n"
					"  gl_TessLevelOuter[2] = 4.0;\n"
					"  gl_TessLevelInner[0] = 4.0;\n"
					"  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					"  vtxColor[gl_InvocationID] = color[gl_InvocationID];\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
				programCollection.glslSources.add("basic_tes") << glu::TessellationEvaluationSource(
					"#version 450 \n"
					"layout(triangles, fractional_even_spacing, ccw) in;\n"
					"layout(location = 0) in highp vec4 colors[];\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"out gl_PerVertex { vec4 gl_Position; };\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\n"
					"void main() \n"
					"{\n"
					"  float u = gl_TessCoord.x;\n"
					"  float v = gl_TessCoord.y;\n"
					"  float w = gl_TessCoord.z;\n"
					"  vec4 pos = vec4(0);\n"
					"  vec4 color = vec4(0);\n"
					"  pos.xyz += u * gl_in[0].gl_Position.xyz;\n"
					"  color.xyz += u * colors[0].xyz;\n"
					"  pos.xyz += v * gl_in[1].gl_Position.xyz;\n"
					"  color.xyz += v * colors[1].xyz;\n"
					"  pos.xyz += w * gl_in[2].gl_Position.xyz;\n"
					"  color.xyz += w * colors[2].xyz;\n"
					"  pos.w = 1.0;\n"
					"  color.w = 1.0;\n"
					"  gl_Position = pos;\n"
					"  vtxColor = color;\n"
					"}\n");
				break;

			default:
				DE_FATAL("Unknown Shader Stage!");
				break;
		};
	}
}